

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall t_c_glib_generator::close_generator(t_c_glib_generator *this)

{
  ostream *poVar1;
  int __fd;
  string program_name_uc;
  string sStack_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  initial_caps_to_underscores(&sStack_78,&local_38);
  to_upper_case(&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<((ostream *)&this->f_types_,"#endif /* ");
  poVar1 = std::operator<<(poVar1,(string *)&this->nspace_uc);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,"_TYPES_H */");
  __fd = 0x36baa0;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void t_c_glib_generator::close_generator() {
  string program_name_uc = to_upper_case(initial_caps_to_underscores(program_name_));

  /* end the header inclusion guard */
  f_types_ << "#endif /* " << this->nspace_uc << program_name_uc << "_TYPES_H */" << endl;

  /* close output file */
  f_types_.close();
  f_types_impl_.close();
}